

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall fmt::v11::format_int::format_signed<long>(format_int *this,long value)

{
  char *pcVar1;
  long in_RSI;
  format_int *in_RDI;
  char *begin;
  bool negative;
  uint32_or_64_or_128_t<long> abs_value;
  unsigned_long in_stack_ffffffffffffffc8;
  char *local_28;
  
  pcVar1 = format_unsigned<unsigned_long>(in_RDI,in_stack_ffffffffffffffc8);
  local_28 = pcVar1;
  if (in_RSI < 0) {
    local_28 = pcVar1 + -1;
    pcVar1[-1] = '-';
  }
  return local_28;
}

Assistant:

FMT_CONSTEXPR20 auto format_signed(Int value) -> char* {
    auto abs_value = static_cast<detail::uint32_or_64_or_128_t<Int>>(value);
    bool negative = value < 0;
    if (negative) abs_value = 0 - abs_value;
    auto begin = format_unsigned(abs_value);
    if (negative) *--begin = '-';
    return begin;
  }